

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::mapsEqual<CoreML::Specification::StringToInt64Map>
               (StringToInt64Map *a,StringToInt64Map *b)

{
  value_type *key;
  long lVar1;
  long *plVar2;
  bool bVar3;
  const_iterator __begin0;
  iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
  local_38;
  
  if ((int)((a->map_).map_.elements_)->num_elements_ ==
      (int)((b->map_).map_.elements_)->num_elements_) {
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
    begin((const_iterator *)&local_38,&(a->map_).map_);
    while (bVar3 = local_38.node_ == (Node *)0x0, !bVar3) {
      key = ((local_38.node_)->kv).v_;
      lVar1 = key->second;
      plVar2 = google::protobuf::
               Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
               ::at(&(b->map_).map_,&key->first);
      if (lVar1 != *plVar2) {
        return bVar3;
      }
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
      InnerMap::
      iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
      ::operator++(&local_38);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool mapsEqual(const T& a, const T& b) {
            if (a.map_size() != b.map_size()) {
                return false;
            }
            for (const auto& p : a.map()) {
                if (p.second != b.map().at(p.first)) {
                    return false;
                }
            }
            return true;
        }